

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<kj::StringPtr_&> __thiscall
kj::Table<kj::StringPtr,kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>>::
find<0ul,kj::String&>
          (Table<kj::StringPtr,kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>> *this,
          char (*params) [7])

{
  uint uVar1;
  size_t __n;
  int iVar2;
  Maybe<kj::StringPtr_&> MVar3;
  undefined4 extraout_var;
  undefined8 *in_RDX;
  char *__s2;
  ulong uVar4;
  long lVar5;
  Iterator iter;
  StringPtr *local_68;
  long local_60;
  Iterator local_58;
  SearchKey local_40;
  char *local_38;
  undefined1 *local_30;
  
  local_30 = (undefined1 *)&local_68;
  local_38 = params[4] + 4;
  local_68 = *(StringPtr **)params;
  local_60 = *(long *)(params[1] + 1) - (long)local_68 >> 4;
  local_40._vptr_SearchKey = (_func_char_7_ **)&PTR_search_00224a78;
  _::BTreeImpl::search(&local_58,(BTreeImpl *)(params[5] + 5),&local_40);
  MVar3.ptr = (StringPtr *)(ulong)local_58.row;
  if ((MVar3.ptr != (StringPtr *)0xe) &&
     (uVar1 = (local_58.leaf)->rows[(long)MVar3.ptr].i, uVar1 != 0)) {
    uVar4 = (ulong)(uVar1 - 1);
    __n = local_68[uVar4].content.size_;
    lVar5 = in_RDX[1];
    MVar3.ptr = local_68;
    if (__n == lVar5 + (ulong)(lVar5 == 0)) {
      if (lVar5 == 0) {
        __s2 = "";
      }
      else {
        __s2 = (char *)*in_RDX;
      }
      iVar2 = bcmp(local_68[uVar4].content.ptr,__s2,__n);
      MVar3.ptr = (StringPtr *)CONCAT44(extraout_var,iVar2);
      if (iVar2 == 0) {
        lVar5 = uVar4 * 0x10 + *(long *)params;
        goto LAB_001646a1;
      }
    }
  }
  lVar5 = 0;
LAB_001646a1:
  *(long *)this = lVar5;
  return (Maybe<kj::StringPtr_&>)MVar3.ptr;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}